

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_function_pool.cpp
# Opt level: O0

void multithreaded(vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                   *frame)

{
  uint32_t uVar1;
  const_reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  *in_RDI;
  ThreadPool *unaff_retaddr;
  uint8_t threshold;
  size_t i;
  Image result;
  Image map;
  Image *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  uint8_t in_stack_ffffffffffffff46;
  uint8_t in_stack_ffffffffffffff47;
  undefined8 in_stack_ffffffffffffff48;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff5c;
  uchar value;
  undefined4 in_stack_ffffffffffffff60;
  ThreadPool *in_stack_ffffffffffffff80;
  size_type local_70;
  ImageTemplate<unsigned_char> local_30;
  
  value = (uchar)((uint)in_stack_ffffffffffffff5c >> 0x18);
  ThreadPoolMonoid::instance();
  ThreadPool::resize(unaff_retaddr,(size_t)in_RDI);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::front((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff47,
                               CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(pvVar2);
  pvVar2 = std::
           vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
           ::front((vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff47,
                               CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
  PenguinV_Image::ImageTemplate<unsigned_char>::height(pvVar2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46
            );
  PenguinV_Image::ImageTemplate<unsigned_char>::fill
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffff60),value);
  PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff50,(uint32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff48,in_stack_ffffffffffffff47,in_stack_ffffffffffffff46
            );
  local_70 = 0;
  while( true ) {
    this = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_70 + 1);
    pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             std::
             vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
             ::size(in_RDI);
    if (pvVar3 <= this) break;
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](in_RDI,local_70 + 1);
    std::
    vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
    ::operator[](in_RDI,local_70);
    Function_Pool::Subtract
              ((Image *)CONCAT17(in_stack_ffffffffffffff47,
                                 CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
               in_stack_ffffffffffffff38,(Image *)0x104174);
    Function_Pool::Histogram(in_stack_ffffffffffffff38);
    in_stack_ffffffffffffff47 =
         Image_Function::GetThreshold
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x104191);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(this);
    if (in_stack_ffffffffffffff47 != '\0') {
      Function_Pool::Threshold
                ((Image *)CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                 in_stack_ffffffffffffff38,'\0');
      Function_Pool::BitwiseOr
                ((Image *)CONCAT17(in_stack_ffffffffffffff47,
                                   CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                 in_stack_ffffffffffffff38,(Image *)0x1041dc);
    }
    local_70 = local_70 + 1;
  }
  ThreadPoolMonoid::instance();
  ThreadPool::stop(in_stack_ffffffffffffff80);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x104264);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x104271);
  return;
}

Assistant:

void multithreaded( const std::vector < PenguinV_Image::Image > & frame )
{
    // okay we setup 4 thread in global thread pool
    ThreadPoolMonoid::instance().resize( 4 );

    // Prepare image map
    PenguinV_Image::Image map( frame.front().width(), frame.front().height() );
    map.fill( 0 );

    PenguinV_Image::Image result( map.width(), map.height() );

    // As you see the only difference in this loop is namespace name
    for( size_t i = 0; i + 1 < frame.size(); ++i ) {
        // subtract one image from another
        Function_Pool::Subtract( frame[i + 1], frame[i], result );

        // find optimal threshold
        uint8_t threshold = Image_Function::GetThreshold( Function_Pool::Histogram( result ) );

        if( threshold > 0 ) { // there is something more than just background!
            // threshold image
            Function_Pool::Threshold( result, result, threshold );
            // add result to the map
            Function_Pool::BitwiseOr( map, result, map );
        }
    }

    // here we have to save the image map but don't do this in the example

    // We stop all threads in thread pool
    ThreadPoolMonoid::instance().stop();
}